

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O1

void __thiscall
StdExceptionCatcher_Tests::std_exception_catcher_does_not_catch_non_std_exception::test_method
          (std_exception_catcher_does_not_catch_non_std_exception *this)

{
  undefined4 *puVar1;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

BOOST_AUTO_TEST_CASE(std_exception_catcher_does_not_catch_non_std_exception)
{
   {
      auto catcher = std_exception_handler(EXIT_FAILURE);
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_THROW(catcher.handleException(), int); // should re-throw an 'int' exception
      }
   }
}